

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacroCommand.cpp
# Opt level: O1

void __thiscall MacroCommand::Execute(MacroCommand *this)

{
  Command **ppCVar1;
  undefined **local_20;
  List<Command_*> *local_18;
  long local_10;
  
  local_18 = *(List<Command_*> **)(this + 8);
  local_20 = &PTR_First_00104d38;
  local_10 = 0;
  if (0 < *(long *)(local_18 + 0x10)) {
    do {
      (*(code *)local_20[2])(&local_20);
      ppCVar1 = List<Command_*>::Get(local_18,local_10);
      (*(*ppCVar1)->_vptr_Command[2])();
      local_10 = local_10 + 1;
    } while (local_10 < *(long *)(local_18 + 0x10));
  }
  return;
}

Assistant:

void MacroCommand::Execute()
{
    ListIterator<Command*> i(_cmds);

    for (i.First(); !i.IsDone(); i.Next())
    {
        Command* c = i.CurrentItem();
        c->Execute();
    }
}